

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sampling.cpp
# Opt level: O3

void phyr::stratifiedSample2D(Point2f *sample,int nxSamples,int nySamples,bool jitter,RNG *rng)

{
  long lVar1;
  byte bVar2;
  int iVar3;
  int iVar4;
  ulong uVar5;
  uint uVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  
  if (0 < nySamples) {
    uVar5 = *(ulong *)rng;
    iVar3 = 0;
    dVar7 = 0.0;
    do {
      if (0 < nxSamples) {
        lVar1 = *(long *)(rng + 8);
        dVar8 = 0.0;
        iVar4 = nxSamples;
        do {
          if (jitter) {
            uVar6 = (uint)(uVar5 >> 0x2d) ^ (uint)(uVar5 >> 0x1b);
            bVar2 = (byte)(uVar5 >> 0x3b);
            uVar5 = uVar5 * 0x5851f42d4c957f2d + lVar1;
            dVar9 = (double)((float)(uVar6 >> bVar2 | uVar6 << 0x20 - bVar2) * 2.3283064e-10);
            if (0.9999999999999999 <= dVar9) {
              dVar9 = 0.9999999999999999;
            }
            uVar6 = (uint)(uVar5 >> 0x2d) ^ (uint)(uVar5 >> 0x1b);
            bVar2 = (byte)(uVar5 >> 0x3b);
            uVar5 = uVar5 * 0x5851f42d4c957f2d + lVar1;
            *(ulong *)rng = uVar5;
            dVar11 = (double)((float)(uVar6 >> bVar2 | uVar6 << 0x20 - bVar2) * 2.3283064e-10);
            if (0.9999999999999999 <= dVar11) {
              dVar11 = 0.9999999999999999;
            }
          }
          else {
            dVar9 = 0.5;
            dVar11 = 0.5;
          }
          dVar10 = (dVar9 + dVar8) * (1.0 / (double)nxSamples);
          dVar9 = 0.9999999999999999;
          if (dVar10 <= 0.9999999999999999) {
            dVar9 = dVar10;
          }
          sample->x = dVar9;
          dVar11 = (dVar11 + dVar7) * (1.0 / (double)nySamples);
          dVar9 = 0.9999999999999999;
          if (dVar11 <= 0.9999999999999999) {
            dVar9 = dVar11;
          }
          sample->y = dVar9;
          sample = sample + 1;
          dVar8 = dVar8 + 1.0;
          iVar4 = iVar4 + -1;
        } while (iVar4 != 0);
      }
      dVar7 = dVar7 + 1.0;
      iVar3 = iVar3 + 1;
    } while (iVar3 != nySamples);
  }
  return;
}

Assistant:

void stratifiedSample2D(Point2f* sample, int nxSamples, int nySamples, bool jitter, RNG& rng) {
    Real invXSamples = Real(1) / nxSamples, invYSamples = Real(1) / nySamples;
    for (int y = 0; y < nySamples; y++) {
        for (int x = 0; x < nxSamples; x++) {
            Real offX = jitter ? rng.uniformReal() : 0.5;
            Real offY = jitter ? rng.uniformReal() : 0.5;
            sample->x = std::min((x + offX) * invXSamples, OneMinusEpsilon);
            sample->y = std::min((y + offY) * invYSamples, OneMinusEpsilon);
            ++sample;
        }
    }
}